

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestApp.cpp
# Opt level: O3

void HomePage(Page *page)

{
  tm *__tp;
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  time_t t;
  time_t local_18;
  
  local_18 = time((time_t *)0x0);
  __tp = localtime(&local_18);
  poVar1 = http::Page::get_output_stream(page);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<span>Current time: ",0x14);
  __s = asctime(__tp);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</span>\n",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<table class=\"table table-striped\">\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  <thead>\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    <th>Protocol</th>\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    <th>Size of class</th>\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  </thead>\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  <tbody>\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    <tr><td>MAC</td><td>",0x18);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</td></tr>\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"     <tr><td>IP</td><td>",0x18);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</td></tr>\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    <tr><td>TCP</td><td>",0x18);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</td></tr>\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    <tr><td>ARP</td><td>",0x18);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</td></tr>\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"   <tr><td>ICMP</td><td>",0x18);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</td></tr>\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"   <tr><td>DHCP</td><td>",0x18);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</td></tr>\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  </tbody>\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</table>\n",9);
  return;
}

Assistant:

void HomePage(http::Page* page)
{
    time_t t = time(nullptr);
    struct tm* now = localtime(&t);
    std::ostream& out = page->get_output_stream();

    out << "<span>Current time: " << asctime(now) << "</span>\n";

    out << "<table class=\"table table-striped\">\n";
    out << "  <thead>\n";
    out << "    <th>Protocol</th>\n";
    out << "    <th>Size of class</th>\n";
    out << "  </thead>\n";
    out << "  <tbody>\n";
    out << "    <tr><td>MAC</td><td>" << sizeof(tcpStack.MAC) << "</td></tr>\n";
    out << "     <tr><td>IP</td><td>" << sizeof(tcpStack.IP) << "</td></tr>\n";
    out << "    <tr><td>TCP</td><td>" << sizeof(tcpStack.TCP) << "</td></tr>\n";
    out << "    <tr><td>ARP</td><td>" << sizeof(tcpStack.ARP) << "</td></tr>\n";
    out << "   <tr><td>ICMP</td><td>" << sizeof(tcpStack.ICMP) << "</td></tr>\n";
    out << "   <tr><td>DHCP</td><td>" << sizeof(tcpStack.DHCP) << "</td></tr>\n";
    out << "  </tbody>\n";
    out << "</table>\n";
}